

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

void __thiscall CCharacterCore::Write(CCharacterCore *this,CNetObj_CharacterCore *pObjCore)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  
  iVar1 = round_to_int(*(float *)(in_RDI + 0x10));
  *(int *)(in_RSI + 4) = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x14));
  *(int *)(in_RSI + 8) = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x18) * 256.0);
  *(int *)(in_RSI + 0xc) = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x1c) * 256.0);
  *(int *)(in_RSI + 0x10) = iVar1;
  *(undefined4 *)(in_RSI + 0x24) = *(undefined4 *)(in_RDI + 0x3c);
  *(undefined4 *)(in_RSI + 0x28) = *(undefined4 *)(in_RDI + 0x38);
  iVar1 = round_to_int(*(float *)(in_RDI + 0x28));
  *(int *)(in_RSI + 0x2c) = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x2c));
  *(int *)(in_RSI + 0x30) = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x30) * 256.0);
  *(int *)(in_RSI + 0x34) = iVar1;
  iVar1 = round_to_int(*(float *)(in_RDI + 0x34) * 256.0);
  *(int *)(in_RSI + 0x38) = iVar1;
  *(undefined4 *)(in_RSI + 0x20) = *(undefined4 *)(in_RDI + 0x40);
  *(undefined4 *)(in_RSI + 0x1c) = *(undefined4 *)(in_RDI + 0x44);
  *(undefined4 *)(in_RSI + 0x18) = *(undefined4 *)(in_RDI + 0x48);
  *(undefined4 *)(in_RSI + 0x14) = *(undefined4 *)(in_RDI + 0x4c);
  return;
}

Assistant:

void CCharacterCore::Write(CNetObj_CharacterCore *pObjCore) const
{
	pObjCore->m_X = round_to_int(m_Pos.x);
	pObjCore->m_Y = round_to_int(m_Pos.y);

	pObjCore->m_VelX = round_to_int(m_Vel.x*256.0f);
	pObjCore->m_VelY = round_to_int(m_Vel.y*256.0f);
	pObjCore->m_HookState = m_HookState;
	pObjCore->m_HookTick = m_HookTick;
	pObjCore->m_HookX = round_to_int(m_HookPos.x);
	pObjCore->m_HookY = round_to_int(m_HookPos.y);
	pObjCore->m_HookDx = round_to_int(m_HookDir.x*256.0f);
	pObjCore->m_HookDy = round_to_int(m_HookDir.y*256.0f);
	pObjCore->m_HookedPlayer = m_HookedPlayer;
	pObjCore->m_Jumped = m_Jumped;
	pObjCore->m_Direction = m_Direction;
	pObjCore->m_Angle = m_Angle;
}